

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

void soul::
     Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
     appendUTF8(string *target,UnicodeChar charToWrite)

{
  int local_1c;
  int numExtraBytes;
  uint32_t c;
  UnicodeChar charToWrite_local;
  string *target_local;
  
  if (charToWrite < 0x80) {
    std::__cxx11::string::operator+=((string *)target,(char)charToWrite);
  }
  else {
    local_1c = 1;
    if ((0x7ff < charToWrite) && (local_1c = 2, 0xffff < charToWrite)) {
      local_1c = 3;
    }
    std::__cxx11::string::operator+=
              ((string *)target,
               (byte)(0xff << (7U - (char)local_1c & 0x1f)) |
               (byte)(charToWrite >> (char)local_1c * '\x06'));
    while (local_1c = local_1c + -1, -1 < local_1c) {
      std::__cxx11::string::operator+=
                ((string *)target,
                 (byte)(charToWrite >> ((char)local_1c * '\x06' & 0x1fU)) & 0x3f | 0x80);
    }
  }
  return;
}

Assistant:

static void appendUTF8 (std::string& target, UnicodeChar charToWrite)
    {
        auto c = (uint32_t) charToWrite;

        if (c >= 0x80)
        {
            int numExtraBytes = 1;

            if (c >= 0x800)
            {
                ++numExtraBytes;

                if (c >= 0x10000)
                    ++numExtraBytes;
            }

            target += (char) ((uint32_t) (0xff << (7 - numExtraBytes)) | (c >> (numExtraBytes * 6)));

            while (--numExtraBytes >= 0)
                target += (char) (0x80 | (0x3f & (c >> (numExtraBytes * 6))));
        }
        else
        {
            target += (char) c;
        }
    }